

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hh
# Opt level: O1

size_t __thiscall
tchecker::
cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
::collect(cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
          *this)

{
  size_type sVar1;
  _Node_iterator_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_true>
  __it;
  
  __it._M_cur = (__node_type *)(this->_hashtable)._table._M_h._M_before_begin._M_nxt;
  sVar1 = (this->_hashtable)._table._M_h._M_element_count;
  if (__it._M_cur != (__node_type *)0x0) {
    do {
      if (*(long *)((long)__it._M_cur + 8) == 0) {
        __assert_fail("_t != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                      ,0x1db,
                      "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t>>::operator->() const [T = tchecker::make_shared_t<tchecker::refzg::zone_t>]"
                     );
      }
      if (*(long *)(*(long *)((long)__it._M_cur + 8) + -8) == 1) {
        __it._M_cur = (__node_type *)
                      std::
                      _Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>_>,_std::__detail::_Identity,_tchecker::intrusive_shared_ptr_delegate_equal_to_t,_tchecker::intrusive_shared_ptr_delegate_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::erase((_Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::refzg::zone_t,_unsigned_long,_1UL>_>_>,_std::__detail::_Identity,_tchecker::intrusive_shared_ptr_delegate_equal_to_t,_tchecker::intrusive_shared_ptr_delegate_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)&this->_hashtable,__it._M_cur);
      }
      else {
        __it._M_cur = *__it._M_cur;
      }
    } while (__it._M_cur != (__node_type *)0x0);
  }
  return sVar1 - (this->_hashtable)._table._M_h._M_element_count;
}

Assistant:

virtual std::size_t collect()
  {
    std::size_t const previous_size = _hashtable.size();
    typename tchecker::hashtable_t<SPTR, HASH, EQUAL>::iterator_t it = _hashtable.begin();
    while (it != _hashtable.end()) {
      if ((*it)->refcount() == 1)
        it = _hashtable.remove(it);
      else
        ++it;
    }
    return previous_size - _hashtable.size();
  }